

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Recorder::Estimate_x_range(ChFunction_Recorder *this,double *xmin,double *xmax)

{
  _List_node_base *p_Var1;
  double dVar2;
  
  p_Var1 = (this->m_points).
           super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)&this->m_points) {
    *xmin = 0.0;
    dVar2 = 1.2;
  }
  else {
    *xmin = (double)p_Var1[1]._M_next;
    p_Var1 = (this->m_points).
             super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>._M_impl.
             _M_node.super__List_node_base._M_prev[1]._M_next;
    *xmax = (double)p_Var1;
    dVar2 = *xmin;
    if (dVar2 != (double)p_Var1) {
      return;
    }
    if (NAN(dVar2) || NAN((double)p_Var1)) {
      return;
    }
    dVar2 = dVar2 + 0.5;
  }
  *xmax = dVar2;
  return;
}

Assistant:

void ChFunction_Recorder::Estimate_x_range(double& xmin, double& xmax) const {
    if (m_points.empty()) {
        xmin = 0.0;
        xmax = 1.2;
        return;
    }

    xmin = m_points.front().x;
    xmax = m_points.back().x;
    if (xmin == xmax)
        xmax = xmin + 0.5;
}